

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::FeatureType::MergeFrom(FeatureType *this,FeatureType *from)

{
  void *pvVar1;
  LogMessage *other;
  Int64FeatureType *pIVar2;
  ArrayFeatureType *pAVar3;
  StringFeatureType *pSVar4;
  ImageFeatureType *pIVar5;
  DoubleFeatureType *pDVar6;
  DictionaryFeatureType *pDVar7;
  SequenceFeatureType *pSVar8;
  ArrayFeatureType *from_00;
  StringFeatureType *from_01;
  ImageFeatureType *from_02;
  Int64FeatureType *from_03;
  DoubleFeatureType *from_04;
  DictionaryFeatureType *from_05;
  SequenceFeatureType *from_06;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O1/mlmodel/format/FeatureTypes.pb.cc"
               ,0x12a0);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if (from->isoptional_ == true) {
    this->isoptional_ = true;
  }
  switch(from->_oneof_case_[0]) {
  case 1:
    if (this->_oneof_case_[0] != 1) {
      clear_Type(this);
      this->_oneof_case_[0] = 1;
      pIVar2 = (Int64FeatureType *)operator_new(0x18);
      Int64FeatureType::Int64FeatureType(pIVar2);
      (this->Type_).int64type_ = pIVar2;
    }
    pIVar2 = (this->Type_).int64type_;
    if (from->_oneof_case_[0] == 1) {
      from_03 = (from->Type_).int64type_;
    }
    else {
      protobuf_FeatureTypes_2eproto::InitDefaults();
      from_03 = (Int64FeatureType *)&_Int64FeatureType_default_instance_;
    }
    Int64FeatureType::MergeFrom(pIVar2,from_03);
    break;
  case 2:
    if (this->_oneof_case_[0] != 2) {
      clear_Type(this);
      this->_oneof_case_[0] = 2;
      pDVar6 = (DoubleFeatureType *)operator_new(0x18);
      DoubleFeatureType::DoubleFeatureType(pDVar6);
      (this->Type_).doubletype_ = pDVar6;
    }
    pDVar6 = (this->Type_).doubletype_;
    if (from->_oneof_case_[0] == 2) {
      from_04 = (from->Type_).doubletype_;
    }
    else {
      protobuf_FeatureTypes_2eproto::InitDefaults();
      from_04 = (DoubleFeatureType *)&_DoubleFeatureType_default_instance_;
    }
    DoubleFeatureType::MergeFrom(pDVar6,from_04);
    break;
  case 3:
    if (this->_oneof_case_[0] != 3) {
      clear_Type(this);
      this->_oneof_case_[0] = 3;
      pSVar4 = (StringFeatureType *)operator_new(0x18);
      StringFeatureType::StringFeatureType(pSVar4);
      (this->Type_).stringtype_ = pSVar4;
    }
    pSVar4 = (this->Type_).stringtype_;
    if (from->_oneof_case_[0] == 3) {
      from_01 = (from->Type_).stringtype_;
    }
    else {
      protobuf_FeatureTypes_2eproto::InitDefaults();
      from_01 = (StringFeatureType *)&_StringFeatureType_default_instance_;
    }
    StringFeatureType::MergeFrom(pSVar4,from_01);
    break;
  case 4:
    if (this->_oneof_case_[0] != 4) {
      clear_Type(this);
      this->_oneof_case_[0] = 4;
      pIVar5 = (ImageFeatureType *)operator_new(0x38);
      ImageFeatureType::ImageFeatureType(pIVar5);
      (this->Type_).imagetype_ = pIVar5;
    }
    pIVar5 = (this->Type_).imagetype_;
    if (from->_oneof_case_[0] == 4) {
      from_02 = (from->Type_).imagetype_;
    }
    else {
      protobuf_FeatureTypes_2eproto::InitDefaults();
      from_02 = (ImageFeatureType *)&_ImageFeatureType_default_instance_;
    }
    ImageFeatureType::MergeFrom(pIVar5,from_02);
    break;
  case 5:
    if (this->_oneof_case_[0] != 5) {
      clear_Type(this);
      this->_oneof_case_[0] = 5;
      pAVar3 = (ArrayFeatureType *)operator_new(0x48);
      ArrayFeatureType::ArrayFeatureType(pAVar3);
      (this->Type_).multiarraytype_ = pAVar3;
    }
    pAVar3 = (this->Type_).multiarraytype_;
    if (from->_oneof_case_[0] == 5) {
      from_00 = (from->Type_).multiarraytype_;
    }
    else {
      protobuf_FeatureTypes_2eproto::InitDefaults();
      from_00 = (ArrayFeatureType *)&_ArrayFeatureType_default_instance_;
    }
    ArrayFeatureType::MergeFrom(pAVar3,from_00);
    break;
  case 6:
    if (this->_oneof_case_[0] != 6) {
      clear_Type(this);
      this->_oneof_case_[0] = 6;
      pDVar7 = (DictionaryFeatureType *)operator_new(0x20);
      DictionaryFeatureType::DictionaryFeatureType(pDVar7);
      (this->Type_).dictionarytype_ = pDVar7;
    }
    pDVar7 = (this->Type_).dictionarytype_;
    if (from->_oneof_case_[0] == 6) {
      from_05 = (from->Type_).dictionarytype_;
    }
    else {
      protobuf_FeatureTypes_2eproto::InitDefaults();
      from_05 = (DictionaryFeatureType *)&_DictionaryFeatureType_default_instance_;
    }
    DictionaryFeatureType::MergeFrom(pDVar7,from_05);
    break;
  case 7:
    if (this->_oneof_case_[0] != 7) {
      clear_Type(this);
      this->_oneof_case_[0] = 7;
      pSVar8 = (SequenceFeatureType *)operator_new(0x28);
      SequenceFeatureType::SequenceFeatureType(pSVar8);
      (this->Type_).sequencetype_ = pSVar8;
    }
    pSVar8 = (this->Type_).sequencetype_;
    if (from->_oneof_case_[0] == 7) {
      from_06 = (from->Type_).sequencetype_;
    }
    else {
      protobuf_FeatureTypes_2eproto::InitDefaults();
      from_06 = (SequenceFeatureType *)&_SequenceFeatureType_default_instance_;
    }
    SequenceFeatureType::MergeFrom(pSVar8,from_06);
  }
  return;
}

Assistant:

void FeatureType::MergeFrom(const FeatureType& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.FeatureType)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.isoptional() != 0) {
    set_isoptional(from.isoptional());
  }
  switch (from.Type_case()) {
    case kInt64Type: {
      mutable_int64type()->::CoreML::Specification::Int64FeatureType::MergeFrom(from.int64type());
      break;
    }
    case kDoubleType: {
      mutable_doubletype()->::CoreML::Specification::DoubleFeatureType::MergeFrom(from.doubletype());
      break;
    }
    case kStringType: {
      mutable_stringtype()->::CoreML::Specification::StringFeatureType::MergeFrom(from.stringtype());
      break;
    }
    case kImageType: {
      mutable_imagetype()->::CoreML::Specification::ImageFeatureType::MergeFrom(from.imagetype());
      break;
    }
    case kMultiArrayType: {
      mutable_multiarraytype()->::CoreML::Specification::ArrayFeatureType::MergeFrom(from.multiarraytype());
      break;
    }
    case kDictionaryType: {
      mutable_dictionarytype()->::CoreML::Specification::DictionaryFeatureType::MergeFrom(from.dictionarytype());
      break;
    }
    case kSequenceType: {
      mutable_sequencetype()->::CoreML::Specification::SequenceFeatureType::MergeFrom(from.sequencetype());
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
}